

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Mio_LibGateSimulate(Mio_Gate_t *pGate,word **ppFaninSims,int nWords,word *pObjSim)

{
  int nVars_00;
  Vec_Int_t *p;
  word wVar1;
  word local_78;
  word uFanins [6];
  Vec_Int_t *vExpr;
  int local_30;
  int nVars;
  int w;
  int i;
  word *pObjSim_local;
  int nWords_local;
  word **ppFaninSims_local;
  Mio_Gate_t *pGate_local;
  
  nVars_00 = Mio_GateReadPinNum(pGate);
  p = Mio_GateReadExpr(pGate);
  if (nVars_00 < 7) {
    for (local_30 = 0; local_30 < nWords; local_30 = local_30 + 1) {
      for (nVars = 0; nVars < nVars_00; nVars = nVars + 1) {
        uFanins[(long)nVars + -1] = ppFaninSims[nVars][local_30];
      }
      wVar1 = Exp_Truth6(nVars_00,p,&local_78);
      pObjSim[local_30] = wVar1;
    }
    return;
  }
  __assert_fail("nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                ,0x216,"void Mio_LibGateSimulate(Mio_Gate_t *, word **, int, word *)");
}

Assistant:

void Mio_LibGateSimulate( Mio_Gate_t * pGate, word * ppFaninSims[6], int nWords, word * pObjSim )
{
    int i, w, nVars = Mio_GateReadPinNum(pGate);
    Vec_Int_t * vExpr = Mio_GateReadExpr( pGate );
    assert( nVars <= 6 );
    for ( w = 0; w < nWords; w++ )
    {
        word uFanins[6];
        for ( i = 0; i < nVars; i++ )
            uFanins[i] = ppFaninSims[i][w];
        pObjSim[w] = Exp_Truth6( nVars, vExpr, uFanins );
    }
}